

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxBitOp::Emit(FxBitOp *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  ExpEmit EVar2;
  int iVar3;
  uint opc;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_58;
  int local_54;
  ExpEmit local_38;
  ExpEmit op2;
  ExpEmit op1;
  int rop;
  int instr;
  VMFunctionBuilder *build_local;
  FxBitOp *this_local;
  ExpEmit to;
  
  iVar3 = PType::GetRegType(((this->super_FxBinary).left)->ValueType);
  if (iVar3 != 0) {
    __assert_fail("left->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe5e,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  iVar3 = PType::GetRegType(((this->super_FxBinary).right)->ValueType);
  if (iVar3 != 0) {
    __assert_fail("right->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe5f,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  ExpEmit::ExpEmit(&op2);
  ExpEmit::ExpEmit(&local_38);
  pFVar1 = (this->super_FxBinary).left;
  op2._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  op2.Konst = (bool)(char)extraout_var;
  op2.Fixed = (bool)(char)((uint)extraout_var >> 8);
  op2.Final = (bool)(char)((uint)extraout_var >> 0x10);
  op2.Target = (bool)(char)((uint)extraout_var >> 0x18);
  pFVar1 = (this->super_FxBinary).right;
  local_38._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  local_38.Konst = (bool)(char)extraout_var_00;
  local_38.Fixed = (bool)(char)((uint)extraout_var_00 >> 8);
  local_38.Final = (bool)(char)((uint)extraout_var_00 >> 0x10);
  local_38.Target = (bool)(char)((uint)extraout_var_00 >> 0x18);
  if (((ulong)op2 & 0x100000000) != 0) {
    swapvalues<ExpEmit>(&op2,&local_38);
  }
  if (((op2.Konst ^ 0xffU) & 1) == 0) {
    __assert_fail("!op1.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe69,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  opc = (uint)local_38.RegNum;
  ExpEmit::Free(&local_38,build);
  ExpEmit::Free(&op2,build);
  if ((this->super_FxBinary).Operator == 0x26) {
    local_54 = 0x77;
  }
  else {
    if ((this->super_FxBinary).Operator == 0x7c) {
      local_58 = 0x79;
    }
    else {
      local_58 = -1;
      if ((this->super_FxBinary).Operator == 0x5e) {
        local_58 = 0x7b;
      }
    }
    local_54 = local_58;
  }
  if (local_54 < 1) {
    __assert_fail("instr > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xe72,"virtual ExpEmit FxBitOp::Emit(VMFunctionBuilder *)");
  }
  ExpEmit::ExpEmit((ExpEmit *)&this_local,build,0,1);
  VMFunctionBuilder::Emit
            (build,local_54 + (uint)(local_38.Konst & 1),(uint)(ushort)this_local,(uint)op2.RegNum,
             opc);
  EVar2.RegType = this_local._2_1_;
  EVar2.RegCount = this_local._3_1_;
  EVar2.Konst = (bool)this_local._4_1_;
  EVar2.Fixed = (bool)this_local._5_1_;
  EVar2.Final = (bool)this_local._6_1_;
  EVar2.Target = (bool)this_local._7_1_;
  EVar2.RegNum = (ushort)this_local;
  return EVar2;
}

Assistant:

ExpEmit FxBitOp::Emit(VMFunctionBuilder *build)
{
	assert(left->ValueType->GetRegType() == REGT_INT);
	assert(right->ValueType->GetRegType() == REGT_INT);
	int instr, rop;
	ExpEmit op1, op2;

	op1 = left->Emit(build);
	op2 = right->Emit(build);
	if (op1.Konst)
	{
		swapvalues(op1, op2);
	}
	assert(!op1.Konst);
	rop = op2.RegNum;
	op2.Free(build);
	op1.Free(build);

	instr = Operator == '&' ? OP_AND_RR :
			Operator == '|' ? OP_OR_RR :
			Operator == '^' ? OP_XOR_RR : -1;

	assert(instr > 0);
	ExpEmit to(build, REGT_INT);
	build->Emit(instr + op2.Konst, to.RegNum, op1.RegNum, rop);
	return to;
}